

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaUtilityTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements
          (cmNinjaUtilityTargetGenerator *this,string *config,string *fileConfig)

{
  pointer *this_00;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *this_01;
  byte bVar1;
  undefined8 uVar2;
  bool bVar3;
  __type _Var4;
  TargetType TVar5;
  cmGlobalNinjaGenerator *gg_00;
  cmLocalNinjaGenerator *this_02;
  string *psVar6;
  const_iterator ppvVar7;
  reference cc_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar8;
  reference ppcVar9;
  cmCustomCommand *cc_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  const_iterator cVar10;
  const_iterator cVar11;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  bVar12;
  MapToNinjaPathImpl MVar13;
  cmNinjaDeps *pcVar14;
  long lVar15;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_04;
  size_type sVar16;
  cmGeneratedFileStream *pcVar17;
  string local_ac8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_aa8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a90;
  CCOutputs local_a78;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  string local_9f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d0;
  undefined1 local_9b0 [8];
  string ccConfig;
  string local_988 [32];
  string_view local_968;
  string local_958;
  allocator<char> local_931;
  string local_930;
  string_view local_910;
  string local_900;
  allocator<char> local_8d9;
  string local_8d8;
  string local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  allocator<char> local_871;
  string local_870;
  cmValue local_850;
  cmValue echoStr;
  string desc;
  string local_820;
  undefined1 local_800 [8];
  string command;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_7a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_798;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_790;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_788;
  undefined1 local_780 [8];
  string outputConfig;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccByproducts;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *ccOutputs;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6e0;
  string local_6b8;
  undefined1 local_698 [8];
  cmCustomCommandGenerator ccg_1;
  cmCustomCommand *cc;
  cmSourceFile *source;
  iterator __end1_1;
  iterator __begin1_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *__range1_1;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sources;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_4d8;
  string local_4b0;
  undefined1 local_490 [8];
  cmCustomCommandGenerator ccg;
  cmCustomCommand *ci;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *__range2;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *cmdList;
  const_iterator __end1;
  const_iterator __begin1;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> *__range1;
  array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> cmdLists;
  undefined1 local_2d8 [7];
  bool uses_terminal;
  CCOutputs util_outputs;
  cmNinjaDeps deps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  string local_268;
  undefined1 local_248 [8];
  cmNinjaBuild phonyBuild;
  cmAlphaNum local_108;
  cmAlphaNum local_d8;
  undefined1 local_a8 [8];
  string utilCommandName;
  undefined1 local_58 [8];
  string configDir;
  cmGeneratorTarget *genTarget;
  cmLocalNinjaGenerator *lg;
  cmGlobalNinjaGenerator *gg;
  string *fileConfig_local;
  string *config_local;
  cmNinjaUtilityTargetGenerator *this_local;
  
  gg_00 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  this_02 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  configDir.field_2._8_8_ =
       cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  std::__cxx11::string::string((string *)local_58);
  bVar3 = cmTarget::IsPerConfig(*(cmTarget **)configDir.field_2._8_8_);
  if (bVar3) {
    (*(gg_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x49])
              ((undefined1 *)((long)&utilCommandName.field_2 + 8),gg_00,fileConfig);
    std::__cxx11::string::operator=
              ((string *)local_58,(string *)(utilCommandName.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(utilCommandName.field_2._M_local_buf + 8));
  }
  psVar6 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_02);
  cmAlphaNum::cmAlphaNum(&local_d8,psVar6);
  cmAlphaNum::cmAlphaNum(&local_108,"/CMakeFiles");
  cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
            ((string *)((long)&phonyBuild.RspFile.field_2 + 8),&this->super_cmNinjaTargetGenerator);
  cmStrCat<std::__cxx11::string,char[2],std::__cxx11::string,char[6]>
            ((string *)local_a8,&local_d8,&local_108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
             (char (*) [2])0xc78192,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&phonyBuild.RspFile.field_2 + 8),(char (*) [6])".util");
  std::__cxx11::string::~string((string *)(phonyBuild.RspFile.field_2._M_local_buf + 8));
  psVar6 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,(string *)local_a8);
  std::__cxx11::string::operator=((string *)local_a8,(string *)psVar6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"phony",
             (allocator<char> *)
             ((long)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_248,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&commands.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&deps.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&util_outputs.WorkDirOuts.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmGlobalNinjaGenerator::CCOutputs::CCOutputs((CCOutputs *)local_2d8,gg_00);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string&>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&util_outputs,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  cmdLists._M_elems[1]._7_1_ = 0;
  __range1 = (array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL> *)
             cmGeneratorTarget::GetPreBuildCommands((cmGeneratorTarget *)configDir.field_2._8_8_);
  cmdLists._M_elems[0] =
       cmGeneratorTarget::GetPostBuildCommands((cmGeneratorTarget *)configDir.field_2._8_8_);
  __end1 = std::array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL>::
           begin((array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL>
                  *)&__range1);
  ppvVar7 = std::array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL>
            ::end((array<const_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_*,_2UL>
                   *)&__range1);
  for (; __end1 != ppvVar7; __end1 = __end1 + 1) {
    this_01 = *__end1;
    __end2 = std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::begin(this_01);
    ci = (cmCustomCommand *)
         std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>::end(this_01);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
                                       *)&ci), bVar3) {
      cc_00 = __gnu_cxx::
              __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
              ::operator*(&__end2);
      ccg.ComputeInternalDepfile._M_invoker = (_Invoker_type)cc_00;
      std::__cxx11::string::string((string *)&local_4b0,(string *)fileConfig);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_4d8);
      this_00 = &sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl
                 .super__Vector_impl_data._M_end_of_storage;
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)this_00);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_490,cc_00,&local_4b0,(cmLocalGenerator *)this_02,
                 true,&local_4d8,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)this_00);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&sources.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_4d8);
      std::__cxx11::string::~string((string *)&local_4b0);
      cmLocalNinjaGenerator::AppendCustomCommandDeps
                (this_02,(cmCustomCommandGenerator *)local_490,
                 (cmNinjaDeps *)
                 &util_outputs.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,fileConfig);
      cmLocalNinjaGenerator::AppendCustomCommandLines
                (this_02,(cmCustomCommandGenerator *)local_490,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&deps.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar8 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_490);
      cmGlobalNinjaGenerator::CCOutputs::Add((CCOutputs *)local_2d8,pvVar8);
      bVar3 = cmCustomCommand::GetUsesTerminal
                        ((cmCustomCommand *)ccg.ComputeInternalDepfile._M_invoker);
      if (bVar3) {
        cmdLists._M_elems[1]._7_1_ = 1;
      }
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_490);
      __gnu_cxx::
      __normal_iterator<const_cmCustomCommand_*,_std::vector<cmCustomCommand,_std::allocator<cmCustomCommand>_>_>
      ::operator++(&__end2);
    }
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_1);
  cmGeneratorTarget::GetSourceFiles
            ((cmGeneratorTarget *)configDir.field_2._8_8_,
             (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_1,config);
  __end1_1 = std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                       ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_1);
  source = (cmSourceFile *)
           std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                     ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_1);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                             *)&source), bVar3) {
    ppcVar9 = __gnu_cxx::
              __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
              ::operator*(&__end1_1);
    cc_01 = cmSourceFile::GetCustomCommand(*ppcVar9);
    ccg_1.ComputeInternalDepfile._M_invoker = (_Invoker_type)cc_01;
    if (cc_01 != (cmCustomCommand *)0x0) {
      std::__cxx11::string::string((string *)&local_6b8,(string *)config);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional(&local_6e0);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&ccOutputs);
      cmCustomCommandGenerator::cmCustomCommandGenerator
                ((cmCustomCommandGenerator *)local_698,cc_01,&local_6b8,(cmLocalGenerator *)this_02,
                 true,&local_6e0,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&ccOutputs);
      std::
      function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                   *)&ccOutputs);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~optional(&local_6e0);
      std::__cxx11::string::~string((string *)&local_6b8);
      cmLocalNinjaGenerator::AddCustomCommandTarget
                (this_02,(cmCustomCommand *)ccg_1.ComputeInternalDepfile._M_invoker,
                 (cmGeneratorTarget *)configDir.field_2._8_8_);
      pvVar8 = cmCustomCommandGenerator::GetOutputs_abi_cxx11_
                         ((cmCustomCommandGenerator *)local_698);
      this_03 = cmCustomCommandGenerator::GetByproducts_abi_cxx11_
                          ((cmCustomCommandGenerator *)local_698);
      cVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(pvVar8);
      cVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(pvVar8);
      bVar12 = std::
               back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&util_outputs.WorkDirOuts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      MVar13 = cmNinjaTargetGenerator::MapToNinjaPath(&this->super_cmNinjaTargetGenerator);
      std::
      transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )cVar10._M_current,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )cVar11._M_current,bVar12,MVar13);
      cVar10 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(this_03);
      cVar11 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(this_03);
      bVar12 = std::
               back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                         ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&util_outputs.WorkDirOuts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
      MVar13 = cmNinjaTargetGenerator::MapToNinjaPath(&this->super_cmNinjaTargetGenerator);
      outputConfig.field_2._8_8_ =
           std::
           transform<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,cmGlobalNinjaGenerator::MapToNinjaPathImpl>
                     ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )cVar10._M_current,
                      (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )cVar11._M_current,bVar12,MVar13);
      cmCustomCommandGenerator::~cmCustomCommandGenerator((cmCustomCommandGenerator *)local_698);
    }
    __gnu_cxx::
    __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
            ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)&__range1_1);
  std::__cxx11::string::string((string *)local_780);
  bVar3 = cmTarget::IsPerConfig(*(cmTarget **)configDir.field_2._8_8_);
  if (bVar3) {
    std::__cxx11::string::operator=((string *)local_780,(string *)config);
  }
  cmLocalNinjaGenerator::AppendTargetOutputs
            (this_02,(cmGeneratorTarget *)configDir.field_2._8_8_,
             (cmNinjaDeps *)((long)&phonyBuild.Rule.field_2 + 8),(string *)local_780);
  TVar5 = cmTarget::GetType(*(cmTarget **)configDir.field_2._8_8_);
  uVar2 = configDir.field_2._8_8_;
  if (TVar5 != GLOBAL_TARGET) {
    pcVar14 = cmGlobalNinjaGenerator::GetByproductsForCleanTarget_abi_cxx11_(gg_00);
    cmLocalNinjaGenerator::AppendTargetOutputs(this_02,(cmGeneratorTarget *)uVar2,pcVar14,config);
    local_788._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&util_outputs);
    local_790._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&util_outputs);
    pcVar14 = cmGlobalNinjaGenerator::GetByproductsForCleanTarget_abi_cxx11_(gg_00);
    local_798 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                             (pcVar14);
    local_7a0 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)std::
                   copy<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             (local_788,local_790,
                              (back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               )local_798);
  }
  cmLocalNinjaGenerator::AppendTargetDepends
            (this_02,(cmGeneratorTarget *)configDir.field_2._8_8_,
             (cmNinjaDeps *)
             &util_outputs.WorkDirOuts.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,config,fileConfig,
             DependOnTargetArtifact);
  bVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&deps.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar3) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
              ((string *)((long)&command.field_2 + 8),&this->super_cmNinjaTargetGenerator);
    std::operator+(&local_7c0,"Utility command for ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8));
    std::__cxx11::string::operator=((string *)local_248,(string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)(command.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&phonyBuild.WorkDirOuts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&util_outputs.WorkDirOuts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)configDir.field_2._8_8_);
    if (TVar5 == GLOBAL_TARGET) {
      pcVar17 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
      cmGlobalNinjaGenerator::WriteBuild
                (gg_00,(ostream *)pcVar17,(cmNinjaBuild *)local_248,0,(bool *)0x0);
    }
    else {
      pcVar17 = cmNinjaTargetGenerator::GetImplFileStream
                          (&this->super_cmNinjaTargetGenerator,fileConfig);
      cmGlobalNinjaGenerator::WriteBuild
                (gg_00,(ostream *)pcVar17,(cmNinjaBuild *)local_248,0,(bool *)0x0);
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"utility",(allocator<char> *)(desc.field_2._M_local_buf + 0xf));
    cmLocalNinjaGenerator::BuildCommandLine
              ((string *)local_800,this_02,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&deps.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,config,fileConfig,&local_820,
               (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
    std::__cxx11::string::~string((string *)&local_820);
    std::allocator<char>::~allocator((allocator<char> *)(desc.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&echoStr);
    uVar2 = configDir.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_870,"EchoString",&local_871)
    ;
    local_850 = cmGeneratorTarget::GetProperty((cmGeneratorTarget *)uVar2,&local_870);
    std::__cxx11::string::~string((string *)&local_870);
    std::allocator<char>::~allocator(&local_871);
    bVar3 = cmValue::operator_cast_to_bool(&local_850);
    if (bVar3) {
      psVar6 = cmValue::operator*[abi_cxx11_(&local_850);
      std::__cxx11::string::operator=((string *)&echoStr,(string *)psVar6);
    }
    else {
      cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                (&local_8b8,&this->super_cmNinjaTargetGenerator);
      std::operator+(&local_898,"Running utility command for ",&local_8b8);
      std::__cxx11::string::operator=((string *)&echoStr,(string *)&local_898);
      std::__cxx11::string::~string((string *)&local_898);
      std::__cxx11::string::~string((string *)&local_8b8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8d8,"$(CMAKE_SOURCE_DIR)",&local_8d9);
    psVar6 = cmLocalGenerator::GetSourceDirectory_abi_cxx11_((cmLocalGenerator *)this_02);
    local_910 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_900,
               &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_910,SHELL);
    cmsys::SystemTools::ReplaceString((string *)local_800,&local_8d8,&local_900);
    std::__cxx11::string::~string((string *)&local_900);
    std::__cxx11::string::~string((string *)&local_8d8);
    std::allocator<char>::~allocator(&local_8d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_930,"$(CMAKE_BINARY_DIR)",&local_931);
    psVar6 = cmLocalGenerator::GetBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this_02);
    local_968 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar6);
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_958,
               &(this_02->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,local_968,SHELL);
    cmsys::SystemTools::ReplaceString((string *)local_800,&local_930,&local_958);
    std::__cxx11::string::~string((string *)&local_958);
    std::__cxx11::string::~string((string *)&local_930);
    std::allocator<char>::~allocator(&local_931);
    cmsys::SystemTools::ReplaceString((string *)local_800,"$(ARGS)","");
    (*(gg_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x16])
              (local_988,gg_00,local_800);
    std::__cxx11::string::operator=((string *)local_800,local_988);
    std::__cxx11::string::~string(local_988);
    lVar15 = std::__cxx11::string::find('\0',0x24);
    if (lVar15 == -1) {
      std::__cxx11::string::string((string *)local_9b0);
      bVar3 = cmTarget::IsPerConfig(*(cmTarget **)configDir.field_2._8_8_);
      if (bVar3) {
        TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)configDir.field_2._8_8_);
        if (TVar5 != GLOBAL_TARGET) {
          std::__cxx11::string::operator=((string *)local_9b0,(string *)config);
        }
      }
      _Var4 = std::operator==(config,fileConfig);
      if (_Var4) {
LAB_005242dd:
        cmNinjaTargetGenerator::GetTargetName_abi_cxx11_
                  (&local_9f0,&this->super_cmNinjaTargetGenerator);
        std::operator+(&local_9d0,"Utility command for ",&local_9f0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a10,"",&local_a11);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"",&local_a39);
        bVar1 = cmdLists._M_elems[1]._7_1_;
        cmGlobalNinjaGenerator::CCOutputs::CCOutputs(&local_a78,(CCOutputs *)local_2d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a90,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&util_outputs.WorkDirOuts.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_aa8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_aa8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_aa8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_aa8);
        cmGlobalNinjaGenerator::WriteCustomCommandBuild
                  (gg_00,(string *)local_800,(string *)&echoStr,&local_9d0,&local_a10,&local_a38,
                   (bool)(bVar1 & 1),true,(string *)local_9b0,&local_a78,&local_a90,&local_aa8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_aa8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a90);
        cmGlobalNinjaGenerator::CCOutputs::~CCOutputs(&local_a78);
        std::__cxx11::string::~string((string *)&local_a38);
        std::allocator<char>::~allocator(&local_a39);
        std::__cxx11::string::~string((string *)&local_a10);
        std::allocator<char>::~allocator(&local_a11);
        std::__cxx11::string::~string((string *)&local_9d0);
        std::__cxx11::string::~string((string *)&local_9f0);
      }
      else {
        this_04 = cmGlobalNinjaGenerator::GetPerConfigUtilityTargets_abi_cxx11_(gg_00);
        psVar6 = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)configDir.field_2._8_8_)
        ;
        sVar16 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::count(this_04,psVar6);
        if (sVar16 != 0) goto LAB_005242dd;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&phonyBuild.WorkDirOuts.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_a8);
      TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)configDir.field_2._8_8_);
      if (TVar5 == GLOBAL_TARGET) {
        pcVar17 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
        cmGlobalNinjaGenerator::WriteBuild
                  (gg_00,(ostream *)pcVar17,(cmNinjaBuild *)local_248,0,(bool *)0x0);
      }
      else {
        pcVar17 = cmNinjaTargetGenerator::GetImplFileStream
                            (&this->super_cmNinjaTargetGenerator,fileConfig);
        cmGlobalNinjaGenerator::WriteBuild
                  (gg_00,(ostream *)pcVar17,(cmNinjaBuild *)local_248,0,(bool *)0x0);
      }
      std::__cxx11::string::~string((string *)local_9b0);
      ccConfig.field_2._12_4_ = 0;
    }
    else {
      ccConfig.field_2._12_4_ = 1;
    }
    std::__cxx11::string::~string((string *)&echoStr);
    std::__cxx11::string::~string((string *)local_800);
    if (ccConfig.field_2._12_4_ != 0) goto LAB_0052472e;
  }
  cmNinjaTargetGenerator::AdditionalCleanFiles(&this->super_cmNinjaTargetGenerator,config);
  TVar5 = cmGeneratorTarget::GetType((cmGeneratorTarget *)configDir.field_2._8_8_);
  if (TVar5 != GLOBAL_TARGET) {
    cmNinjaTargetGenerator::GetTargetName_abi_cxx11_(&local_ac8,&this->super_cmNinjaTargetGenerator)
    ;
    cmGlobalNinjaGenerator::AddTargetAlias
              (gg_00,&local_ac8,(cmGeneratorTarget *)configDir.field_2._8_8_,config);
    std::__cxx11::string::~string((string *)&local_ac8);
  }
  ccConfig.field_2._12_4_ = 0;
LAB_0052472e:
  std::__cxx11::string::~string((string *)local_780);
  cmGlobalNinjaGenerator::CCOutputs::~CCOutputs((CCOutputs *)local_2d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&util_outputs.WorkDirOuts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&deps.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_248);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void cmNinjaUtilityTargetGenerator::WriteUtilBuildStatements(
  std::string const& config, std::string const& fileConfig)
{
  cmGlobalNinjaGenerator* gg = this->GetGlobalGenerator();
  cmLocalNinjaGenerator* lg = this->GetLocalGenerator();
  cmGeneratorTarget* genTarget = this->GetGeneratorTarget();

  std::string configDir;
  if (genTarget->Target->IsPerConfig()) {
    configDir = gg->ConfigDirectory(fileConfig);
  }
  std::string utilCommandName =
    cmStrCat(lg->GetCurrentBinaryDirectory(), "/CMakeFiles", configDir, "/",
             this->GetTargetName(), ".util");
  utilCommandName = this->ConvertToNinjaPath(utilCommandName);

  cmNinjaBuild phonyBuild("phony");
  std::vector<std::string> commands;
  cmNinjaDeps deps;
  cmGlobalNinjaGenerator::CCOutputs util_outputs(gg);
  util_outputs.ExplicitOuts.emplace_back(utilCommandName);

  bool uses_terminal = false;
  {
    std::array<std::vector<cmCustomCommand> const*, 2> const cmdLists = {
      { &genTarget->GetPreBuildCommands(), &genTarget->GetPostBuildCommands() }
    };

    for (std::vector<cmCustomCommand> const* cmdList : cmdLists) {
      for (cmCustomCommand const& ci : *cmdList) {
        cmCustomCommandGenerator ccg(ci, fileConfig, lg);
        lg->AppendCustomCommandDeps(ccg, deps, fileConfig);
        lg->AppendCustomCommandLines(ccg, commands);
        util_outputs.Add(ccg.GetByproducts());
        if (ci.GetUsesTerminal()) {
          uses_terminal = true;
        }
      }
    }
  }

  {
    std::vector<cmSourceFile*> sources;
    genTarget->GetSourceFiles(sources, config);
    for (cmSourceFile const* source : sources) {
      if (cmCustomCommand const* cc = source->GetCustomCommand()) {
        cmCustomCommandGenerator ccg(*cc, config, lg);
        lg->AddCustomCommandTarget(cc, genTarget);

        // Depend on all custom command outputs.
        const std::vector<std::string>& ccOutputs = ccg.GetOutputs();
        const std::vector<std::string>& ccByproducts = ccg.GetByproducts();
        std::transform(ccOutputs.begin(), ccOutputs.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
        std::transform(ccByproducts.begin(), ccByproducts.end(),
                       std::back_inserter(deps), this->MapToNinjaPath());
      }
    }
  }

  std::string outputConfig;
  if (genTarget->Target->IsPerConfig()) {
    outputConfig = config;
  }
  lg->AppendTargetOutputs(genTarget, phonyBuild.Outputs, outputConfig);
  if (genTarget->Target->GetType() != cmStateEnums::GLOBAL_TARGET) {
    lg->AppendTargetOutputs(genTarget, gg->GetByproductsForCleanTarget(),
                            config);
    std::copy(util_outputs.ExplicitOuts.begin(),
              util_outputs.ExplicitOuts.end(),
              std::back_inserter(gg->GetByproductsForCleanTarget()));
  }
  lg->AppendTargetDepends(genTarget, deps, config, fileConfig,
                          DependOnTargetArtifact);

  if (commands.empty()) {
    phonyBuild.Comment = "Utility command for " + this->GetTargetName();
    phonyBuild.ExplicitDeps = std::move(deps);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  } else {
    std::string command = lg->BuildCommandLine(
      commands, config, fileConfig, "utility", this->GeneratorTarget);
    std::string desc;
    cmValue echoStr = genTarget->GetProperty("EchoString");
    if (echoStr) {
      desc = *echoStr;
    } else {
      desc = "Running utility command for " + this->GetTargetName();
    }

    // TODO: fix problematic global targets.  For now, search and replace the
    // makefile vars.
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_SOURCE_DIR)",
      lg->ConvertToOutputFormat(lg->GetSourceDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(
      command, "$(CMAKE_BINARY_DIR)",
      lg->ConvertToOutputFormat(lg->GetBinaryDirectory(),
                                cmOutputConverter::SHELL));
    cmSystemTools::ReplaceString(command, "$(ARGS)", "");
    command = gg->ExpandCFGIntDir(command, config);

    if (command.find('$') != std::string::npos) {
      return;
    }

    std::string ccConfig;
    if (genTarget->Target->IsPerConfig() &&
        genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      ccConfig = config;
    }
    if (config == fileConfig ||
        gg->GetPerConfigUtilityTargets().count(genTarget->GetName())) {
      gg->WriteCustomCommandBuild(
        command, desc, "Utility command for " + this->GetTargetName(),
        /*depfile*/ "", /*job_pool*/ "", uses_terminal,
        /*restat*/ true, ccConfig, std::move(util_outputs), std::move(deps));
    }

    phonyBuild.ExplicitDeps.push_back(utilCommandName);
    if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
      gg->WriteBuild(this->GetImplFileStream(fileConfig), phonyBuild);
    } else {
      gg->WriteBuild(this->GetCommonFileStream(), phonyBuild);
    }
  }

  // Find ADDITIONAL_CLEAN_FILES
  this->AdditionalCleanFiles(config);

  // Add an alias for the logical target name regardless of what directory
  // contains it.  Skip this for GLOBAL_TARGET because they are meant to
  // be per-directory and have one at the top-level anyway.
  if (genTarget->GetType() != cmStateEnums::GLOBAL_TARGET) {
    gg->AddTargetAlias(this->GetTargetName(), genTarget, config);
  }
}